

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_conjunction.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ExpressionExecutor::Select
          (ExpressionExecutor *this,BoundConjunctionExpression *expr,ExpressionState *state_p,
          SelectionVector *sel,idx_t count,SelectionVector *true_sel,SelectionVector *false_sel)

{
  ExpressionType EVar1;
  _Head_base<0UL,_duckdb::SelectionVector_*,_false> _Var2;
  pointer pAVar3;
  reference pvVar4;
  const_reference pvVar5;
  type pEVar6;
  reference pvVar7;
  idx_t iVar8;
  pointer pSVar9;
  ulong uVar10;
  idx_t iVar11;
  idx_t i;
  ulong uVar12;
  idx_t iVar13;
  SelectionVector *sel_00;
  idx_t i_1;
  ulong uVar14;
  idx_t i_2;
  long lVar15;
  idx_t count_00;
  unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true> temp_false
  ;
  unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true> temp_true;
  idx_t current_count;
  _Head_base<0UL,_duckdb::SelectionVector_*,_false> local_98;
  _Head_base<0UL,_duckdb::SelectionVector_*,_false> local_90;
  _Head_base<0UL,_duckdb::SelectionVector_*,_false> local_88;
  uint local_7c;
  ExpressionState *local_78;
  SelectionVector *local_70;
  ExpressionState *local_68;
  SelectionVector *local_60;
  BoundConjunctionExpression *local_58;
  idx_t local_50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  ExpressionExecutor *local_40;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_38;
  
  EVar1 = (expr->super_Expression).super_BaseExpression.type;
  local_78 = state_p + 1;
  local_70 = sel;
  local_68 = state_p;
  local_58 = expr;
  local_50 = count;
  local_40 = this;
  pAVar3 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
           operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                       *)local_78);
  local_48.__d.__r = (duration)AdaptiveFilter::BeginFilter(pAVar3);
  sel_00 = local_70;
  if (EVar1 == CONJUNCTION_AND) {
    local_90._M_head_impl = (SelectionVector *)0x0;
    local_98._M_head_impl = (SelectionVector *)0x0;
    if (false_sel != (SelectionVector *)0x0) {
      local_7c = 0x800;
      make_uniq<duckdb::SelectionVector,unsigned_int>((duckdb *)&local_88,&local_7c);
      _Var2._M_head_impl = local_88._M_head_impl;
      local_88._M_head_impl = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
      ::reset((__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
               *)&local_98,_Var2._M_head_impl);
      ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>::
      ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
                   *)&local_88);
    }
    if (true_sel == (SelectionVector *)0x0) {
      local_7c = 0x800;
      make_uniq<duckdb::SelectionVector,unsigned_int>((duckdb *)&local_88,&local_7c);
      _Var2._M_head_impl = local_88._M_head_impl;
      local_88._M_head_impl = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
      ::reset((__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
               *)&local_90,_Var2._M_head_impl);
      ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>::
      ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
                   *)&local_88);
      true_sel = local_90._M_head_impl;
    }
    local_60 = (SelectionVector *)&local_58->children;
    local_68 = (ExpressionState *)&local_68->child_states;
    lVar15 = 0;
    count_00 = local_50;
    for (uVar12 = 0;
        uVar12 < (ulong)((long)(local_58->children).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_58->children).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1)
    {
      pAVar3 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
               ::operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                             *)local_78);
      pvVar4 = vector<unsigned_long,_true>::get<true>(&pAVar3->permutation,uVar12);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)local_60,*pvVar4);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar5);
      pAVar3 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
               ::operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                             *)local_78);
      pvVar4 = vector<unsigned_long,_true>::get<true>(&pAVar3->permutation,uVar12);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                            *)local_68,*pvVar4);
      iVar8 = Select(local_40,pEVar6,
                     (pvVar7->
                     super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                     .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,local_70,
                     count_00,true_sel,local_98._M_head_impl);
      if ((false_sel != (SelectionVector *)0x0) && (count_00 != iVar8)) {
        for (uVar14 = 0; count_00 - iVar8 != uVar14; uVar14 = uVar14 + 1) {
          pSVar9 = unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                   ::operator->((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                                 *)&local_98);
          uVar10 = uVar14;
          if (pSVar9->sel_vector != (sel_t *)0x0) {
            uVar10 = (ulong)pSVar9->sel_vector[uVar14];
          }
          false_sel->sel_vector[lVar15] = (sel_t)uVar10;
          lVar15 = lVar15 + 1;
        }
      }
      if (iVar8 == 0) {
        count_00 = 0;
        break;
      }
      if (iVar8 < local_50) {
        local_70 = true_sel;
      }
      count_00 = iVar8;
    }
    pAVar3 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
             operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                         *)local_78);
    AdaptiveFilter::EndFilter(pAVar3,(AdaptiveFilterState)local_48.__d.__r);
  }
  else {
    local_90._M_head_impl = (SelectionVector *)0x0;
    local_98._M_head_impl = (SelectionVector *)0x0;
    if (true_sel != (SelectionVector *)0x0) {
      local_7c = 0x800;
      make_uniq<duckdb::SelectionVector,unsigned_int>((duckdb *)&local_88,&local_7c);
      _Var2._M_head_impl = local_88._M_head_impl;
      local_88._M_head_impl = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
      ::reset((__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
               *)&local_90,_Var2._M_head_impl);
      ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>::
      ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
                   *)&local_88);
    }
    if (false_sel == (SelectionVector *)0x0) {
      local_7c = 0x800;
      make_uniq<duckdb::SelectionVector,unsigned_int>((duckdb *)&local_88,&local_7c);
      _Var2._M_head_impl = local_88._M_head_impl;
      local_88._M_head_impl = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
      ::reset((__uniq_ptr_impl<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
               *)&local_98,_Var2._M_head_impl);
      ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>::
      ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>
                   *)&local_88);
      false_sel = local_98._M_head_impl;
    }
    local_38 = &local_58->children;
    local_68 = (ExpressionState *)&local_68->child_states;
    count_00 = 0;
    local_60 = false_sel;
    for (uVar12 = 0;
        uVar12 < (ulong)((long)(local_58->children).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_58->children).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1)
    {
      pAVar3 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
               ::operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                             *)local_78);
      pvVar4 = vector<unsigned_long,_true>::get<true>(&pAVar3->permutation,uVar12);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(local_38,*pvVar4);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar5);
      pAVar3 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
               ::operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                             *)local_78);
      pvVar4 = vector<unsigned_long,_true>::get<true>(&pAVar3->permutation,uVar12);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::get<true>((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                            *)local_68,*pvVar4);
      iVar8 = Select(local_40,pEVar6,
                     (pvVar7->
                     super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
                     .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel_00,
                     local_50,local_90._M_head_impl,local_60);
      if (iVar8 != 0) {
        if (true_sel != (SelectionVector *)0x0) {
          for (iVar13 = 0; iVar8 != iVar13; iVar13 = iVar13 + 1) {
            pSVar9 = unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                     ::operator->((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>,_true>
                                   *)&local_90);
            iVar11 = iVar13;
            if (pSVar9->sel_vector != (sel_t *)0x0) {
              iVar11 = (idx_t)pSVar9->sel_vector[iVar13];
            }
            true_sel->sel_vector[count_00] = (sel_t)iVar11;
            count_00 = count_00 + 1;
          }
        }
        local_50 = local_50 - iVar8;
        sel_00 = local_60;
      }
    }
    if (true_sel != (SelectionVector *)0x0) {
      SelectionVector::Sort(true_sel,count_00);
    }
    pAVar3 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>::
             operator->((unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                         *)local_78);
    AdaptiveFilter::EndFilter(pAVar3,(AdaptiveFilterState)local_48.__d.__r);
  }
  ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>::
  ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_> *)
              &local_98);
  ::std::unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_>::
  ~unique_ptr((unique_ptr<duckdb::SelectionVector,_std::default_delete<duckdb::SelectionVector>_> *)
              &local_90);
  return count_00;
}

Assistant:

idx_t ExpressionExecutor::Select(const BoundConjunctionExpression &expr, ExpressionState *state_p,
                                 const SelectionVector *sel, idx_t count, SelectionVector *true_sel,
                                 SelectionVector *false_sel) {
	auto &state = state_p->Cast<ConjunctionState>();

	if (expr.GetExpressionType() == ExpressionType::CONJUNCTION_AND) {
		// get runtime statistics
		auto filter_state = state.adaptive_filter->BeginFilter();
		const SelectionVector *current_sel = sel;
		idx_t current_count = count;
		idx_t false_count = 0;

		unique_ptr<SelectionVector> temp_true, temp_false;
		if (false_sel) {
			temp_false = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
		}
		if (!true_sel) {
			temp_true = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
			true_sel = temp_true.get();
		}
		for (idx_t i = 0; i < expr.children.size(); i++) {
			idx_t tcount = Select(*expr.children[state.adaptive_filter->permutation[i]],
			                      state.child_states[state.adaptive_filter->permutation[i]].get(), current_sel,
			                      current_count, true_sel, temp_false.get());
			idx_t fcount = current_count - tcount;
			if (fcount > 0 && false_sel) {
				// move failing tuples into the false_sel
				// tuples passed, move them into the actual result vector
				for (idx_t i = 0; i < fcount; i++) {
					false_sel->set_index(false_count++, temp_false->get_index(i));
				}
			}
			current_count = tcount;
			if (current_count == 0) {
				break;
			}
			if (current_count < count) {
				// tuples were filtered out: move on to using the true_sel to only evaluate passing tuples in subsequent
				// iterations
				current_sel = true_sel;
			}
		}
		// adapt runtime statistics
		state.adaptive_filter->EndFilter(filter_state);
		return current_count;
	} else {
		// get runtime statistics
		auto filter_state = state.adaptive_filter->BeginFilter();

		const SelectionVector *current_sel = sel;
		idx_t current_count = count;
		idx_t result_count = 0;

		unique_ptr<SelectionVector> temp_true, temp_false;
		if (true_sel) {
			temp_true = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
		}
		if (!false_sel) {
			temp_false = make_uniq<SelectionVector>(STANDARD_VECTOR_SIZE);
			false_sel = temp_false.get();
		}
		for (idx_t i = 0; i < expr.children.size(); i++) {
			idx_t tcount = Select(*expr.children[state.adaptive_filter->permutation[i]],
			                      state.child_states[state.adaptive_filter->permutation[i]].get(), current_sel,
			                      current_count, temp_true.get(), false_sel);
			if (tcount > 0) {
				if (true_sel) {
					// tuples passed, move them into the actual result vector
					for (idx_t i = 0; i < tcount; i++) {
						true_sel->set_index(result_count++, temp_true->get_index(i));
					}
				}
				// now move on to check only the non-passing tuples
				current_count -= tcount;
				current_sel = false_sel;
			}
		}
		if (true_sel) {
			true_sel->Sort(result_count);
		}

		// adapt runtime statistics
		state.adaptive_filter->EndFilter(filter_state);
		return result_count;
	}
}